

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void cimg_library::CImgDisplay::_render_resize<unsigned_int,unsigned_int>
               (uint *ptrs,uint ws,uint hs,uint *ptrd,uint wd,uint hd)

{
  ulong uVar1;
  long local_100;
  ulongT dy;
  long *plStack_f0;
  uint x_1;
  ulongT *poff_x_1;
  uint *ptr;
  long *plStack_d8;
  uint y_1;
  ulongT *poff_y;
  ulongT old_1;
  ulong uStack_c0;
  uint y;
  ulongT curr_1;
  ulongT *poff_y_1;
  ulong local_a8;
  ulongT old;
  ulong uStack_98;
  uint x;
  ulongT curr;
  ulongT *poff_x;
  undefined1 local_70 [8];
  CImg<unsigned_long> off_y;
  CImg<unsigned_long> off_x;
  ulongT one;
  uint hd_local;
  uint wd_local;
  uint *ptrd_local;
  uint hs_local;
  uint ws_local;
  uint *ptrs_local;
  
  CImg<unsigned_long>::CImg((CImg<unsigned_long> *)&off_y._data,wd,1,1,1);
  CImg<unsigned_long>::CImg((CImg<unsigned_long> *)local_70,hd + 1,1,1,1);
  if (wd == ws) {
    poff_x = (ulongT *)0x1;
    CImg<unsigned_long>::fill((CImg<unsigned_long> *)&off_y._data,(unsigned_long *)&poff_x);
  }
  else {
    curr = off_x._16_8_;
    uStack_98 = 0;
    for (old._4_4_ = 0; old._4_4_ < wd; old._4_4_ = old._4_4_ + 1) {
      local_a8 = uStack_98;
      uVar1 = (((ulong)old._4_4_ + 1) * (ulong)ws) / (ulong)wd;
      *(ulong *)curr = uVar1 - uStack_98;
      uStack_98 = uVar1;
      curr = curr + 8;
    }
  }
  if (hd == hs) {
    poff_y_1 = (ulongT *)(ulong)ws;
    CImg<unsigned_long>::fill((CImg<unsigned_long> *)local_70,(unsigned_long *)&poff_y_1);
  }
  else {
    curr_1 = off_y._16_8_;
    uStack_c0 = 0;
    for (old_1._4_4_ = 0; old_1._4_4_ < hd; old_1._4_4_ = old_1._4_4_ + 1) {
      uVar1 = (((ulong)old_1._4_4_ + 1) * (ulong)hs) / (ulong)hd;
      *(ulong *)curr_1 = (ulong)ws * (uVar1 - uStack_c0);
      uStack_c0 = uVar1;
      curr_1 = curr_1 + 8;
    }
    *(undefined8 *)curr_1 = 0;
  }
  plStack_d8 = (long *)off_y._16_8_;
  ptr._4_4_ = 0;
  _hd_local = ptrd;
  _hs_local = (ulongT *)ptrs;
  while (ptr._4_4_ < hd) {
    poff_x_1 = _hs_local;
    plStack_f0 = (long *)off_x._16_8_;
    for (dy._4_4_ = 0; dy._4_4_ < wd; dy._4_4_ = dy._4_4_ + 1) {
      *_hd_local = (uint)*poff_x_1;
      poff_x_1 = (ulongT *)(*plStack_f0 * 4 + (long)poff_x_1);
      plStack_f0 = plStack_f0 + 1;
      _hd_local = _hd_local + 1;
    }
    local_100 = *plStack_d8;
    while( true ) {
      plStack_d8 = plStack_d8 + 1;
      ptr._4_4_ = ptr._4_4_ + 1;
      if (local_100 != 0 || hd <= ptr._4_4_) break;
      memcpy(_hd_local,_hd_local + -(ulong)wd,(ulong)wd << 2);
      _hd_local = _hd_local + wd;
      local_100 = *plStack_d8;
    }
    _hs_local = (ulongT *)(local_100 * 4 + (long)_hs_local);
  }
  CImg<unsigned_long>::~CImg((CImg<unsigned_long> *)local_70);
  CImg<unsigned_long>::~CImg((CImg<unsigned_long> *)&off_y._data);
  return;
}

Assistant:

static void _render_resize(const T *ptrs, const unsigned int ws, const unsigned int hs,
                               t *ptrd, const unsigned int wd, const unsigned int hd) {
      typedef typename cimg::last<T,cimg_ulong>::type ulongT;
      const ulongT one = (ulongT)1;
      CImg<ulongT> off_x(wd), off_y(hd + 1);
      if (wd==ws) off_x.fill(1);
      else {
        ulongT *poff_x = off_x._data, curr = 0;
        for (unsigned int x = 0; x<wd; ++x) {
          const ulongT old = curr;
          curr = (x + one)*ws/wd;
          *(poff_x++) = curr - old;
        }
      }
      if (hd==hs) off_y.fill(ws);
      else {
        ulongT *poff_y = off_y._data, curr = 0;
        for (unsigned int y = 0; y<hd; ++y) {
          const ulongT old = curr;
          curr = (y + one)*hs/hd;
          *(poff_y++) = ws*(curr - old);
        }
        *poff_y = 0;
      }
      ulongT *poff_y = off_y._data;
      for (unsigned int y = 0; y<hd; ) {
        const T *ptr = ptrs;
        ulongT *poff_x = off_x._data;
        for (unsigned int x = 0; x<wd; ++x) { *(ptrd++) = *ptr; ptr+=*(poff_x++); }
        ++y;
        ulongT dy = *(poff_y++);
        for ( ; !dy && y<hd; std::memcpy(ptrd,ptrd - wd,sizeof(t)*wd), ++y, ptrd+=wd, dy = *(poff_y++)) {}
        ptrs+=dy;
      }
    }